

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateMergingCode
          (StringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  Formatter *in_RDI;
  Formatter format;
  Printer *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffd8;
  Formatter *in_stack_ffffffffffffffe0;
  
  Formatter::Formatter
            (in_RDI,in_stack_ffffffffffffff98,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x571f8b);
  bVar1 = SupportsArenas((FieldDescriptor *)0x571f99);
  if (!bVar1) {
    pOVar2 = FieldDescriptor::containing_oneof(*(FieldDescriptor **)&(in_RDI->vars_)._M_t._M_impl);
    if (pOVar2 == (OneofDescriptor *)0x0) {
      Formatter::operator()<>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      goto LAB_0057200b;
    }
  }
  Formatter::operator()<>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
LAB_0057200b:
  Formatter::~Formatter((Formatter *)0x572015);
  return;
}

Assistant:

void StringFieldGenerator::GenerateMergingCode(io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (SupportsArenas(descriptor_) || descriptor_->containing_oneof() != NULL) {
    // TODO(gpike): improve this
    format("_internal_set_$name$(from._internal_$name$());\n");
  } else {
    format(
        "$set_hasbit$\n"
        "$name$_.AssignWithDefault($default_variable$, from.$name$_);\n");
  }
}